

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DerTypes.h
# Opt level: O0

bool __thiscall AnyType::OutputFromType<BitString>(AnyType *this,ostream *os)

{
  bool bVar1;
  undefined1 local_40 [7];
  bool fConverted;
  BitString t;
  ostream *os_local;
  AnyType *this_local;
  
  t.value.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)os;
  BitString::BitString((BitString *)local_40);
  bVar1 = ConvertToType<BitString>(this,(BitString *)local_40);
  if (bVar1) {
    ::operator<<((ostream *)
                 t.value.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage,(BitString *)local_40);
  }
  BitString::~BitString((BitString *)local_40);
  return bVar1;
}

Assistant:

bool OutputFromType(std::ostream& os) const 
    {
        T t;
        bool fConverted = ConvertToType(t);
        if (fConverted)
            os << t;

        return fConverted;
    }